

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSelect.c
# Opt level: O0

int If_ManNodeShapeMap(If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Int_t *vShape)

{
  int iVar1;
  If_Cut_t *pIVar2;
  If_Cut_t *pIVar3;
  bool bVar4;
  int local_3c;
  int iRes;
  int i;
  If_Obj_t *pLeaf;
  If_Cut_t *pCut;
  Vec_Int_t *vShape_local;
  If_Obj_t *pIfObj_local;
  If_Man_t *pIfMan_local;
  
  pIVar2 = If_ObjCutBest(pIfObj);
  if (*(uint *)&pIVar2->field_0x1c >> 0x18 < 2) {
    __assert_fail("pCut->nLeaves > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifSelect.c"
                  ,0x87,"int If_ManNodeShapeMap(If_Man_t *, If_Obj_t *, Vec_Int_t *)");
  }
  local_3c = 0;
  while( true ) {
    bVar4 = false;
    if (local_3c < (int)(*(uint *)&pIVar2->field_0x1c >> 0x18)) {
      _iRes = If_ManObj(pIfMan,(int)(&pIVar2[1].Area)[local_3c]);
      bVar4 = _iRes != (If_Obj_t *)0x0;
    }
    if (!bVar4) break;
    pIVar3 = If_ObjCutBest(_iRes);
    iVar1 = If_CutDataInt(pIVar3);
    if (iVar1 != 0) {
      __assert_fail("If_CutDataInt( If_ObjCutBest(pLeaf) ) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifSelect.c"
                    ,0x8b,"int If_ManNodeShapeMap(If_Man_t *, If_Obj_t *, Vec_Int_t *)");
    }
    pIVar3 = If_ObjCutBest(_iRes);
    If_CutSetDataInt(pIVar3,1);
    local_3c = local_3c + 1;
  }
  Vec_IntClear(vShape);
  Vec_PtrClear(pIfMan->vTemp);
  iVar1 = If_ManNodeShapeMap_rec(pIfMan,pIfObj,pIfMan->vTemp,vShape);
  if (iVar1 == -1) {
    Abc_Print(-1,"If_ManNodeShapeMap(): Computing local AIG has failed.\n");
    pIfMan_local._4_4_ = 0;
  }
  else {
    local_3c = 0;
    while( true ) {
      bVar4 = false;
      if (local_3c < (int)(*(uint *)&pIVar2->field_0x1c >> 0x18)) {
        _iRes = If_ManObj(pIfMan,(int)(&pIVar2[1].Area)[local_3c]);
        bVar4 = _iRes != (If_Obj_t *)0x0;
      }
      if (!bVar4) break;
      pIVar3 = If_ObjCutBest(_iRes);
      If_CutSetDataInt(pIVar3,0);
      local_3c = local_3c + 1;
    }
    for (local_3c = 0; iVar1 = Vec_PtrSize(pIfMan->vTemp), local_3c < iVar1; local_3c = local_3c + 1
        ) {
      pIVar2 = (If_Cut_t *)Vec_PtrEntry(pIfMan->vTemp,local_3c);
      If_CutSetDataInt(pIVar2,0);
    }
    pIfMan_local._4_4_ = 1;
  }
  return pIfMan_local._4_4_;
}

Assistant:

int If_ManNodeShapeMap( If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vShape )
{
    If_Cut_t * pCut;
    If_Obj_t * pLeaf;
    int i, iRes;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    assert( pCut->nLeaves > 1 );
    // set the leaf variables
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
    {
        assert( If_CutDataInt( If_ObjCutBest(pLeaf) ) == 0 );
        If_CutSetDataInt( If_ObjCutBest(pLeaf), 1 );
    }
    // recursively compute the function while collecting visited cuts
    Vec_IntClear( vShape );
    Vec_PtrClear( pIfMan->vTemp );
    iRes = If_ManNodeShapeMap_rec( pIfMan, pIfObj, pIfMan->vTemp, vShape ); 
    if ( iRes == ~0 )
    {
        Abc_Print( -1, "If_ManNodeShapeMap(): Computing local AIG has failed.\n" );
        return 0;
    }
    // clean the cuts
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetDataInt( If_ObjCutBest(pLeaf), 0 );
    Vec_PtrForEachEntry( If_Cut_t *, pIfMan->vTemp, pCut, i )
        If_CutSetDataInt( pCut, 0 );
    return 1;
}